

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# TriangularArray.hpp
# Opt level: O0

void __thiscall Lib::TriangularArray<int>::setSide(TriangularArray<int> *this,size_t side)

{
  size_t sVar1;
  unsigned_long *puVar2;
  void *placement;
  int *piVar3;
  long in_RSI;
  TriangularArray<int> *in_RDI;
  void *mem;
  size_t newCapacity;
  size_t in_stack_ffffffffffffffd0;
  size_t local_28;
  unsigned_long local_20;
  unsigned_long local_18;
  
  in_RDI->_2sideMinus1 = in_RSI * 2 - 1;
  sVar1 = dataSize(in_RDI);
  if (in_RDI->_capacity < sVar1) {
    local_20 = in_RDI->_capacity << 1;
    local_28 = dataSize(in_RDI);
    puVar2 = std::max<unsigned_long>(&local_20,&local_28);
    local_18 = *puVar2;
    placement = Lib::alloc(in_stack_ffffffffffffffd0);
    array_delete<int>(in_RDI->_data,in_RDI->_capacity);
    Lib::free(in_RDI->_data);
    in_RDI->_capacity = local_18;
    piVar3 = array_new<int>(placement,in_RDI->_capacity);
    in_RDI->_data = piVar3;
  }
  return;
}

Assistant:

void setSide(size_t side)
  {
    ASS_G(side,0);
    _2sideMinus1=2*side-1;
    if(dataSize()>_capacity) {
      size_t newCapacity=std::max(_capacity*2, dataSize());
      void * mem=ALLOC_KNOWN(newCapacity*sizeof(T), "Lib::TriangularArray");

      array_delete(_data, _capacity);
      DEALLOC_KNOWN(_data, _capacity*sizeof(T), "Lib::TriangularArray");

      _capacity=newCapacity;
      _data=array_new<T>(mem, _capacity);
    }
  }